

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ord_hash_set.h
# Opt level: O0

size_t __thiscall re2c::ord_hash_set_t::insert(ord_hash_set_t *this,void *data,size_t size)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  size_type index_00;
  mapped_type *ppeVar4;
  elem_t *peVar5;
  size_t index;
  elem_t *e;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_> local_38;
  const_iterator i;
  hash_t h;
  size_t size_local;
  void *data_local;
  ord_hash_set_t *this_local;
  
  i._M_node = (_Base_ptr)hash(data,size);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
       ::find(&this->lookup,(key_type_conflict *)&i);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>::
  _Rb_tree_const_iterator(&local_38,&local_40);
  e = (elem_t *)
      std::
      map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
      ::end(&this->lookup);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>::
  _Rb_tree_const_iterator(&local_48,(iterator *)&e);
  bVar1 = std::operator!=(&local_38,&local_48);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>
             ::operator->(&local_38);
    for (index = (size_t)ppVar3->second; index != 0; index = *(size_t *)index) {
      if ((*(size_t *)(index + 0x10) == size) &&
         (iVar2 = memcmp((void *)(index + 0x18),data,size), iVar2 == 0)) {
        return *(size_t *)(index + 8);
      }
    }
  }
  index_00 = std::
             vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
             ::size(&this->elems);
  ppeVar4 = std::
            map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
            ::operator[](&this->lookup,(key_type_conflict *)&i);
  peVar5 = make_elem(this,*ppeVar4,index_00,size,data);
  ppeVar4 = std::
            map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
            ::operator[](&this->lookup,(key_type_conflict *)&i);
  *ppeVar4 = peVar5;
  std::vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>::
  push_back(&this->elems,ppeVar4);
  return index_00;
}

Assistant:

size_t ord_hash_set_t::insert(const void *data, size_t size)
{
	const hash_t h = hash(data, size);

	std::map<hash_t, elem_t*>::const_iterator i = lookup.find(h);
	if (i != lookup.end())
	{
		for (elem_t *e = i->second; e; e = e->next)
		{
			if (e->size == size
				&& memcmp(e->data, data, size) == 0)
			{
				return e->index;
			}
		}
	}

	const size_t index = elems.size();
	elems.push_back(lookup[h] = make_elem(lookup[h], index, size, data));
	return index;
}